

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_account.c
# Opt level: O0

char * IoTHubAccount_GetEventhubListenName(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  char *value;
  IOTHUB_ACCOUNT_INFO_HANDLE acctHandle_local;
  
  l = (LOGGER_LOG)getenv("IOTHUB_EVENTHUB_LISTEN_NAME");
  if (l == (LOGGER_LOG)0x0) {
    l = (LOGGER_LOG)IoTHubAccount_GetIoTHubName(acctHandle);
  }
  if (((l != (LOGGER_LOG)0x0) &&
      (iVar1 = sprintf_s(IoTHubAccount_GetEventhubListenName::listenName,0x40,"%s",l), iVar1 < 1))
     && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/testtools/iothub_test/src/iothub_account.c"
              ,"IoTHubAccount_GetEventhubListenName",0x3a5,1,
              "Failed reading IoT Hub Event Hub listen namespace (sprintf_s failed).");
  }
  return IoTHubAccount_GetEventhubListenName::listenName;
}

Assistant:

const char* IoTHubAccount_GetEventhubListenName(IOTHUB_ACCOUNT_INFO_HANDLE acctHandle)
{
    static char listenName[64];
    const char* value;

#ifndef MBED_BUILD_TIMESTAMP
    if ((value = getenv("IOTHUB_EVENTHUB_LISTEN_NAME")) == NULL)
#else
    if ((value = getMbedParameter("IOTHUB_EVENTHUB_LISTEN_NAME")) == NULL)
#endif
    {
        value = IoTHubAccount_GetIoTHubName(acctHandle);
    }

    if (value != NULL &&
        sprintf_s(listenName, 64, "%s", value) <= 0)
    {
        LogError("Failed reading IoT Hub Event Hub listen namespace (sprintf_s failed).");
    }

    return listenName;
}